

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall FileTokenizer::skipWhitespace(FileTokenizer *this)

{
  ulong uVar1;
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  string local_a8;
  undefined1 local_88 [64];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  this_00 = &this->currentLine;
  paVar2 = &local_a8.field_2;
LAB_0014c17c:
  do {
    uVar7 = (this->currentLine)._M_string_length;
    uVar8 = this->linePos;
    if (uVar8 < uVar7) {
      cVar3 = (this_00->_M_dataplus)._M_p[uVar8];
      if ((cVar3 == ' ') || (cVar3 == '\t')) {
        sVar4 = this->linePos;
        uVar8 = sVar4 + 1;
        this->linePos = uVar8;
        if (uVar8 < uVar7) {
          pcVar5 = (this_00->_M_dataplus)._M_p;
          uVar8 = sVar4 + 2;
          do {
            cVar3 = pcVar5[uVar8 - 1];
            if ((cVar3 != ' ') && (cVar3 != '\t')) break;
            this->linePos = uVar8;
            bVar9 = uVar8 != uVar7;
            uVar8 = uVar8 + 1;
          } while (bVar9);
        }
        goto LAB_0014c17c;
      }
      if ((uVar7 <= uVar8) || ((this_00->_M_dataplus)._M_p[uVar8] != ';')) goto LAB_0014c200;
    }
    else {
LAB_0014c200:
      uVar1 = uVar8 + 1;
      if (((uVar7 <= uVar1) || (pcVar5 = (this_00->_M_dataplus)._M_p, pcVar5[uVar8] != '/')) ||
         (pcVar5[uVar1] != '/')) {
        if (((uVar7 <= uVar1) || (pcVar5 = (this_00->_M_dataplus)._M_p, pcVar5[uVar8] != '/')) ||
           (pcVar5[uVar1] != '*')) {
          return;
        }
        this->linePos = uVar8 + 2;
LAB_0014c247:
        uVar8 = (this->currentLine)._M_string_length;
        sVar4 = this->linePos;
        uVar7 = sVar4 + 1;
        if (uVar8 <= uVar7) {
          this->linePos = uVar7;
          goto LAB_0014c282;
        }
        pcVar5 = (this_00->_M_dataplus)._M_p;
        if ((pcVar5[sVar4] != '*') || (pcVar5[uVar7] != '/')) break;
        uVar7 = sVar4 + 2;
      }
    }
    this->linePos = uVar7;
  } while( true );
  this->linePos = uVar7;
  if (uVar8 <= uVar7) {
LAB_0014c282:
    if (((this->currentLine)._M_string_length <= uVar7) &&
       (bVar9 = TextFile::atEnd(this->input), bVar9)) {
      sVar4 = this->linePos;
      local_a8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Unexpected end of file in block comment","");
      createToken(this,Invalid,sVar4,&local_a8,0,local_a8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_88._0_8_ = (this->token).line;
      local_88._8_5_ = (undefined5)(this->token).column;
      uVar6 = *(undefined8 *)((long)&(this->token).column + 5);
      local_88._13_3_ = (undefined3)uVar6;
      local_88._16_5_ = (undefined5)((ulong)uVar6 >> 0x18);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                       *)(local_88 + 0x18),
                      (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                       *)&(this->token).value);
      pcVar5 = (this->token).originalText._M_dataplus._M_p;
      local_48._M_p = (pointer)&local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar5,pcVar5 + (this->token).originalText._M_string_length);
      std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
                ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,(Token *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_p != &local_38) {
        operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)(local_88 + 0x18));
      return;
    }
    TextFile::readLine_abi_cxx11_(&local_a8,this->input);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    this->linePos = 0;
    this->lineNumber = this->lineNumber + 1;
  }
  goto LAB_0014c247;
}

Assistant:

void FileTokenizer::skipWhitespace()
{
	while (true)
	{
		if (isWhitespace(currentLine,linePos))
		{
			do { linePos++; } while (isWhitespace(currentLine,linePos));
		} else if (isComment(currentLine,linePos))
		{
			linePos = currentLine.size();
		} else if (isBlockComment(currentLine,linePos))
		{
			linePos += 2;
			while(!isBlockCommentEnd(currentLine,linePos))
			{
				linePos++;
				if (linePos >= currentLine.size())
				{
					if (isInputAtEnd())
					{
						createToken(TokenType::Invalid,linePos, "Unexpected end of file in block comment");
						addToken(token);
						return;
					}
					currentLine = input->readLine();
					linePos = 0;
					lineNumber++;
				}
			}
			linePos += 2;
		} else
		{
			break;
		}
	}
}